

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<spirv_cross::SPIRString&>
          (ObjectPool<spirv_cross::SPIRString> *this,SPIRString *p)

{
  Vector<spirv_cross::SPIRString_*> *this_00;
  SPIRString *pSVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  SPIRString *ptr;
  SPIRString *local_40;
  SPIRString *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
  if (sVar2 == 0) {
    uVar3 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRString *)malloc(uVar3 * 0x30);
    if (pSVar1 == (SPIRString *)0x0) {
      return (SPIRString *)0x0;
    }
    local_38 = pSVar1;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRString_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRString,spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRString*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRString,spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRString_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRString_*,_0UL>::pop_back(this_00);
  SPIRString::SPIRString(pSVar1,p);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}